

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void GCTM(lua_State *L)

{
  lu_byte lVar1;
  global_State *pgVar2;
  GCObject *pGVar3;
  lu_mem lVar4;
  StkId pTVar5;
  TValue *local_68;
  TValue *local_60;
  TValue *i_o;
  TValue *o1;
  TValue *o2;
  lu_mem oldt;
  lu_byte oldah;
  TValue *tm;
  Udata *udata;
  GCObject *o;
  global_State *g;
  lua_State *L_local;
  
  pgVar2 = L->l_G;
  pGVar3 = (pgVar2->tmudata->gch).next;
  if (pGVar3 == pgVar2->tmudata) {
    pgVar2->tmudata = (GCObject *)0x0;
  }
  else {
    (pgVar2->tmudata->gch).next = (pGVar3->gch).next;
  }
  (pGVar3->gch).next = pgVar2->mainthread->next;
  pgVar2->mainthread->next = pGVar3;
  (pGVar3->gch).marked = (pGVar3->gch).marked & 0xf8 | pgVar2->currentwhite & 3;
  if ((pGVar3->h).metatable == (Table *)0x0) {
    local_60 = (TValue *)0x0;
  }
  else {
    if ((((pGVar3->h).metatable)->flags & 4) == 0) {
      local_68 = luaT_gettm((pGVar3->h).metatable,TM_GC,L->l_G->tmname[2]);
    }
    else {
      local_68 = (TValue *)0x0;
    }
    local_60 = local_68;
  }
  if (local_60 != (TValue *)0x0) {
    lVar1 = L->allowhook;
    lVar4 = pgVar2->GCthreshold;
    L->allowhook = '\0';
    pgVar2->GCthreshold = pgVar2->totalbytes << 1;
    pTVar5 = L->top;
    pTVar5->value = local_60->value;
    pTVar5->tt = local_60->tt;
    pTVar5 = L->top;
    pTVar5[1].value.gc = pGVar3;
    pTVar5[1].tt = 7;
    L->top = L->top + 2;
    luaD_call(L,L->top + -2,0);
    L->allowhook = lVar1;
    pgVar2->GCthreshold = lVar4;
  }
  return;
}

Assistant:

static void GCTM(lua_State*L){
global_State*g=G(L);
GCObject*o=g->tmudata->gch.next;
Udata*udata=rawgco2u(o);
const TValue*tm;
if(o==g->tmudata)
g->tmudata=NULL;
else
g->tmudata->gch.next=udata->uv.next;
udata->uv.next=g->mainthread->next;
g->mainthread->next=o;
makewhite(g,o);
tm=fasttm(L,udata->uv.metatable,TM_GC);
if(tm!=NULL){
lu_byte oldah=L->allowhook;
lu_mem oldt=g->GCthreshold;
L->allowhook=0;
g->GCthreshold=2*g->totalbytes;
setobj(L,L->top,tm);
setuvalue(L,L->top+1,udata);
L->top+=2;
luaD_call(L,L->top-2,0);
L->allowhook=oldah;
g->GCthreshold=oldt;
}
}